

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O1

bool __thiscall ccel::canbus::canbus_handler::loopback(canbus_handler *this,bool turn)

{
  int iVar1;
  runtime_error *this_00;
  undefined1 local_11;
  
  local_11 = turn;
  iVar1 = setsockopt((this->_stream).super_descriptor.
                     super_basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>.
                     implementation_.descriptor_,0x65,3,&local_11,1);
  if (-1 < iVar1) {
    (this->super_base_handler).field_0x29 = local_11;
    return (bool)local_11;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"[CANBus Handler]Enabling loopback failed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const bool canbus_handler::loopback(const bool turn) {
  if(setsockopt(_stream.native_handle(), SOL_CAN_RAW, CAN_RAW_LOOPBACK, &turn,
                sizeof(turn)) < 0)
    throw std::runtime_error("[CANBus Handler]Enabling loopback failed.");
  _loopback = turn;
  return _loopback;
}